

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deformableconv2d_x86.cpp
# Opt level: O1

void __thiscall ncnn::DeformableConv2D_x86::DeformableConv2D_x86(DeformableConv2D_x86 *this)

{
  DeformableConv2D::DeformableConv2D((DeformableConv2D *)&this->field_0x60);
  this->_vptr_DeformableConv2D_x86 = (_func_int **)&PTR_create_pipeline_005e2738;
  *(undefined ***)&this->field_0x60 = &PTR__DeformableConv2D_x86_005e27b8;
  *(undefined2 *)&this->field_0x68 = 0;
  (this->weight_data_t).data = (void *)0x0;
  (this->weight_data_t).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_data_t).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_data_t).elemsize + 4) = 0;
  (this->weight_data_t).allocator = (Allocator *)0x0;
  (this->weight_data_t).dims = 0;
  (this->weight_data_t).w = 0;
  (this->weight_data_t).w = 0;
  (this->weight_data_t).h = 0;
  (this->weight_data_t).d = 0;
  (this->weight_data_t).c = 0;
  (this->weight_data_t).cstep = 0;
  this->inner_product = (Layer *)0x0;
  this->permute = (Layer *)0x0;
  return;
}

Assistant:

DeformableConv2D_x86::DeformableConv2D_x86()
{
    one_blob_only = false;
    support_inplace = false;

    inner_product = 0;
    permute = 0;
}